

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O2

void aom_fft_2d_gen(float *input,float *temp,float *output,int n,aom_fft_1d_func_t tform,
                   aom_fft_transpose_func_t transpose,aom_fft_unpack_func_t unpack,int vec_size)

{
  float *pfVar1;
  long lVar2;
  int x;
  long lVar3;
  float *pfVar4;
  
  lVar2 = (long)vec_size;
  pfVar1 = output;
  for (lVar3 = 0; lVar3 < n; lVar3 = lVar3 + lVar2) {
    (*tform)(input,pfVar1,n);
    input = input + lVar2;
    pfVar1 = pfVar1 + lVar2;
  }
  (*transpose)(output,temp,n);
  pfVar1 = output;
  pfVar4 = temp;
  for (lVar3 = 0; lVar3 < n; lVar3 = lVar3 + lVar2) {
    (*tform)(pfVar4,pfVar1,n);
    pfVar4 = pfVar4 + lVar2;
    pfVar1 = pfVar1 + lVar2;
  }
  (*transpose)(output,temp,n);
  (*unpack)(temp,output,n);
  return;
}

Assistant:

void aom_fft_2d_gen(const float *input, float *temp, float *output, int n,
                    aom_fft_1d_func_t tform, aom_fft_transpose_func_t transpose,
                    aom_fft_unpack_func_t unpack, int vec_size) {
  for (int x = 0; x < n; x += vec_size) {
    tform(input + x, output + x, n);
  }
  transpose(output, temp, n);

  for (int x = 0; x < n; x += vec_size) {
    tform(temp + x, output + x, n);
  }
  transpose(output, temp, n);

  unpack(temp, output, n);
}